

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexTriangleAdjacency.cpp
# Opt level: O1

void __thiscall
Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency
          (VertexTriangleAdjacency *this,aiFace *pcFaces,uint iNumFaces,uint iNumVertices,
          bool bComputeNumTriangles)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  aiFace *paVar4;
  uint *puVar5;
  void *pvVar6;
  uint *puVar7;
  long lVar8;
  aiFace *paVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  aiFace *pcFace;
  
  paVar9 = pcFaces + iNumFaces;
  paVar4 = pcFaces;
  if (iNumFaces != 0 && iNumVertices == 0) {
    do {
      if (paVar4 == (aiFace *)0x0) {
        __assert_fail("nullptr != pcFace",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/VertexTriangleAdjacency.cpp"
                      ,0x3f,
                      "Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency(aiFace *, unsigned int, unsigned int, bool)"
                     );
      }
      if (paVar4->mNumIndices != 3) {
        __assert_fail("3 == pcFace->mNumIndices",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/VertexTriangleAdjacency.cpp"
                      ,0x40,
                      "Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency(aiFace *, unsigned int, unsigned int, bool)"
                     );
      }
      puVar5 = paVar4->mIndices;
      if (iNumVertices <= *puVar5) {
        iNumVertices = *puVar5;
      }
      if (iNumVertices <= puVar5[1]) {
        iNumVertices = puVar5[1];
      }
      if (iNumVertices <= puVar5[2]) {
        iNumVertices = puVar5[2];
      }
      paVar4 = paVar4 + 1;
    } while (paVar4 != paVar9);
  }
  uVar11 = iNumVertices + 1;
  this->mNumVertices = uVar11;
  if (bComputeNumTriangles) {
    puVar5 = (uint *)operator_new__((ulong)uVar11 << 2);
    this->mLiveTriangles = puVar5;
    memset(puVar5,0,(ulong)uVar11 << 2);
    pvVar6 = operator_new__((ulong)(iNumVertices + 2) << 2);
    this->mOffsetTable = (uint *)((long)pvVar6 + 4);
  }
  else {
    pvVar6 = operator_new__((ulong)(iNumVertices + 2) << 2);
    puVar5 = (uint *)((long)pvVar6 + 4);
    this->mOffsetTable = puVar5;
    memset(puVar5,0,(ulong)uVar11 << 2);
    this->mLiveTriangles = (uint *)0x0;
  }
  puVar5[iNumVertices] = 0;
  paVar4 = pcFaces;
  if (iNumFaces != 0) {
    do {
      uVar11 = paVar4->mNumIndices;
      puVar7 = paVar4->mIndices;
      if (uVar11 != 0) {
        puVar5[*puVar7] = puVar5[*puVar7] + 1;
      }
      if (1 < uVar11) {
        puVar5[puVar7[1]] = puVar5[puVar7[1]] + 1;
      }
      if (2 < uVar11) {
        puVar5[puVar7[2]] = puVar5[puVar7[2]] + 1;
      }
      paVar4 = paVar4 + 1;
    } while (paVar4 != paVar9);
  }
  uVar12 = 0;
  if (puVar5 != puVar5 + iNumVertices + 1) {
    puVar7 = this->mOffsetTable;
    lVar8 = 0;
    do {
      iVar10 = (int)uVar12;
      uVar11 = *(int *)((long)puVar5 + lVar8) + iVar10;
      uVar12 = (ulong)uVar11;
      *(int *)((long)puVar7 + lVar8) = iVar10;
      lVar8 = lVar8 + 4;
    } while ((ulong)iNumVertices * 4 + 4 != lVar8);
    uVar12 = (ulong)uVar11 << 2;
  }
  puVar5 = this->mOffsetTable;
  puVar7 = (uint *)operator_new__(uVar12);
  this->mAdjacencyTable = puVar7;
  if (iNumFaces != 0) {
    uVar11 = 0;
    do {
      uVar1 = pcFaces->mNumIndices;
      puVar7 = pcFaces->mIndices;
      if (uVar1 != 0) {
        puVar3 = this->mAdjacencyTable;
        uVar2 = puVar5[*puVar7];
        puVar5[*puVar7] = uVar2 + 1;
        puVar3[uVar2] = uVar11;
      }
      if (1 < uVar1) {
        puVar3 = this->mAdjacencyTable;
        uVar2 = puVar5[puVar7[1]];
        puVar5[puVar7[1]] = uVar2 + 1;
        puVar3[uVar2] = uVar11;
      }
      if (2 < uVar1) {
        puVar3 = this->mAdjacencyTable;
        uVar1 = puVar5[puVar7[2]];
        puVar5[puVar7[2]] = uVar1 + 1;
        puVar3[uVar1] = uVar11;
      }
      pcFaces = pcFaces + 1;
      uVar11 = uVar11 + 1;
    } while (pcFaces != paVar9);
  }
  puVar5 = this->mOffsetTable;
  this->mOffsetTable = puVar5 + -1;
  puVar5[-1] = 0;
  return;
}

Assistant:

VertexTriangleAdjacency::VertexTriangleAdjacency(aiFace *pcFaces,
    unsigned int iNumFaces,
    unsigned int iNumVertices /*= 0*/,
    bool bComputeNumTriangles /*= false*/)
{
    // compute the number of referenced vertices if it wasn't specified by the caller
    const aiFace* const pcFaceEnd = pcFaces + iNumFaces;
    if (0 == iNumVertices)  {
        for (aiFace* pcFace = pcFaces; pcFace != pcFaceEnd; ++pcFace)   {
            ai_assert( nullptr != pcFace );
            ai_assert(3 == pcFace->mNumIndices);
            iNumVertices = std::max(iNumVertices,pcFace->mIndices[0]);
            iNumVertices = std::max(iNumVertices,pcFace->mIndices[1]);
            iNumVertices = std::max(iNumVertices,pcFace->mIndices[2]);
        }
    }

    mNumVertices = iNumVertices + 1;

    unsigned int* pi;

    // allocate storage
    if (bComputeNumTriangles)   {
        pi = mLiveTriangles = new unsigned int[iNumVertices+1];
        ::memset(mLiveTriangles,0,sizeof(unsigned int)*(iNumVertices+1));
        mOffsetTable = new unsigned int[iNumVertices+2]+1;
    } else {
        pi = mOffsetTable = new unsigned int[iNumVertices+2]+1;
        ::memset(mOffsetTable,0,sizeof(unsigned int)*(iNumVertices+1));
        mLiveTriangles = NULL; // important, otherwise the d'tor would crash
    }

    // get a pointer to the end of the buffer
    unsigned int* piEnd = pi+iNumVertices;
    *piEnd++ = 0u;

    // first pass: compute the number of faces referencing each vertex
    for (aiFace* pcFace = pcFaces; pcFace != pcFaceEnd; ++pcFace)
    {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;
        if (nind > 0) pi[ind[0]]++;
        if (nind > 1) pi[ind[1]]++;
        if (nind > 2) pi[ind[2]]++;
    }

    // second pass: compute the final offset table
    unsigned int iSum = 0;
    unsigned int* piCurOut = this->mOffsetTable;
    for (unsigned int* piCur = pi; piCur != piEnd;++piCur,++piCurOut)   {

        unsigned int iLastSum = iSum;
        iSum += *piCur;
        *piCurOut = iLastSum;
    }
    pi = this->mOffsetTable;

    // third pass: compute the final table
    this->mAdjacencyTable = new unsigned int[iSum];
    iSum = 0;
    for (aiFace* pcFace = pcFaces; pcFace != pcFaceEnd; ++pcFace,++iSum)    {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;

        if (nind > 0) mAdjacencyTable[pi[ind[0]]++] = iSum;
        if (nind > 1) mAdjacencyTable[pi[ind[1]]++] = iSum;
        if (nind > 2) mAdjacencyTable[pi[ind[2]]++] = iSum;
    }
    // fourth pass: undo the offset computations made during the third pass
    // We could do this in a separate buffer, but this would be TIMES slower.
    --mOffsetTable;
    *mOffsetTable = 0u;
}